

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O1

bool test64Deserialize(string *filename)

{
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> __last;
  undefined8 uVar1;
  size_t __n;
  char *orig;
  ulong uVar2;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  anon_class_16_2_3f31b43f __f;
  vector<char,_std::allocator<char>_> buf1;
  vector<char,_std::allocator<char>_> buf2;
  ifstream in;
  char *local_2b8;
  char *local_2b0;
  size_t *local_2a0;
  undefined1 local_298 [32];
  _Base_ptr local_278;
  size_t sStack_270;
  bool local_268;
  Roaring64Map local_258;
  long local_220 [29];
  undefined8 auStack_138 [36];
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/testdata/"
                 ,filename);
  std::ifstream::ifstream(local_220,(string *)local_298,_S_bin);
  if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
    operator_delete((void *)local_298._0_8_);
  }
  __first._8_8_ = 0xffffffff;
  __first._M_sbuf = *(streambuf_type **)((long)auStack_138 + *(long *)(local_220[0] + -0x18));
  std::vector<char,std::allocator<char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<char,std::allocator<char>> *)&local_2b8,__first,
             (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40),
             (allocator_type *)local_298);
  printf("Reading %lu bytes\n",(long)local_2b0 - (long)local_2b8);
  __last._M_node = (_Base_ptr)(local_298 + 8);
  local_298._16_8_ = 0;
  local_298._0_8_ = (pointer)0x0;
  local_298._8_8_ = 0;
  sStack_270 = 0;
  local_268 = false;
  local_298._24_8_ = __last._M_node;
  local_278 = __last._M_node;
  roaring::Roaring64Map::readSafe(&local_258,local_2b8,(long)local_2b0 - (long)local_2b8);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
           *)local_298);
  if (local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    local_298._8_4_ = local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    local_298._16_8_ = local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_298._24_8_ = local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_278 = local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         __last._M_node;
    sStack_270 = local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)((long)&local_258 + 8U);
    local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)((long)&local_258 + 8U);
  }
  local_268 = local_258.copyOnWrite;
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_258);
  __n = roaring::Roaring64Map::getSizeInBytes((Roaring64Map *)local_298,true);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_258,__n,(allocator_type *)&local_2a0);
  _assert_true((ulong)((long)local_2b0 - (long)local_2b8 ==
                      CONCAT44(local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
                               ,local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_color) - local_258.roarings._M_t._M_impl._0_8_),
               "buf1.size() == buf2.size()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x80d);
  uVar1 = local_258.roarings._M_t._M_impl._0_8_;
  *(size_t *)local_258.roarings._M_t._M_impl._0_8_ = sStack_270;
  local_2a0 = (size_t *)(local_258.roarings._M_t._M_impl._0_8_ + 8);
  __f._8_8_ = 1;
  __f.buf = (char **)&local_2a0;
  std::
  for_each<std::_Rb_tree_const_iterator<std::pair<unsigned_int_const,roaring::Roaring>>,roaring::Roaring64Map::write(char*,bool)const::_lambda(std::pair<unsigned_int_const,roaring::Roaring>const&)_1_>
            ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>)
             local_298._24_8_,__last,__f);
  _assert_true((ulong)((long)local_2a0 - uVar1 ==
                      CONCAT44(local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
                               ,local_258.roarings._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_color) - local_258.roarings._M_t._M_impl._0_8_),
               "roaring.write(buf2.data()) == buf2.size()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x80e);
  if (local_2b0 != local_2b8) {
    uVar2 = 0;
    do {
      _assert_true((ulong)(local_2b8[uVar2] ==
                          *(char *)(local_258.roarings._M_t._M_impl._0_8_ + uVar2)),
                   "buf1[i] == buf2[i]",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                   ,0x810);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)((long)local_2b0 - (long)local_2b8));
  }
  if ((size_t *)local_258.roarings._M_t._M_impl._0_8_ != (size_t *)0x0) {
    operator_delete((void *)local_258.roarings._M_t._M_impl._0_8_);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)local_298);
  if (local_2b8 != (char *)0x0) {
    operator_delete(local_2b8);
  }
  std::ifstream::~ifstream(local_220);
  return true;
}

Assistant:

bool test64Deserialize(const std::string &filename) {
#if CROARING_IS_BIG_ENDIAN
    (void)filename;
    printf("Big-endian IO unsupported.\n");
#else  // CROARING_IS_BIG_ENDIAN
    std::ifstream in(TEST_DATA_DIR + filename, std::ios::binary);
    std::vector<char> buf1(std::istreambuf_iterator<char>(in), {});
    printf("Reading %lu bytes\n", (unsigned long)buf1.size());
    Roaring64Map roaring;
#if ROARING_EXCEPTIONS
    try {
        roaring = Roaring64Map::readSafe(buf1.data(), buf1.size());
    } catch (...) {
        return false;
    }
#else   // ROARING_EXCEPTIONS
    roaring = Roaring64Map::readSafe(buf1.data(), buf1.size());
#endif  // ROARING_EXCEPTIONS
    std::vector<char> buf2(roaring.getSizeInBytes());
    assert_true(buf1.size() == buf2.size());
    assert_true(roaring.write(buf2.data()) == buf2.size());
    for (size_t i = 0; i < buf1.size(); ++i) {
        assert_true(buf1[i] == buf2[i]);
    }
#endif  // CROARING_IS_BIG_ENDIAN
    return true;
}